

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  int iVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  stbi_uc *psVar8;
  byte bVar9;
  byte bVar10;
  
  psVar3 = s->img_buffer;
  psVar8 = s->img_buffer_end;
  if (psVar3 < psVar8) {
LAB_00129a8c:
    psVar3 = psVar3 + 1;
    s->img_buffer = psVar3;
  }
  else if (s->read_from_callbacks != 0) {
    iVar5 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
    if (iVar5 == 0) {
      s->read_from_callbacks = 0;
      psVar8 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      psVar8 = s->buffer_start + iVar5;
    }
    s->img_buffer_end = psVar8;
    psVar3 = s->buffer_start;
    goto LAB_00129a8c;
  }
  if (psVar3 < psVar8) {
    psVar4 = psVar3 + 1;
    s->img_buffer = psVar4;
    bVar9 = *psVar3;
LAB_00129b0d:
    psVar3 = psVar4;
    if (1 < bVar9) goto LAB_00129eac;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        psVar8 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        bVar9 = 0;
      }
      else {
        psVar8 = psVar3 + iVar5;
        bVar9 = *psVar3;
      }
      s->img_buffer_end = psVar8;
      psVar4 = s->buffer_start + 1;
      s->img_buffer = psVar4;
      goto LAB_00129b0d;
    }
    bVar9 = 0;
  }
  if (psVar3 < psVar8) {
    s->img_buffer = psVar3 + 1;
    bVar7 = *psVar3;
    psVar3 = psVar3 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar7 = 0;
  }
  else {
    psVar3 = s->buffer_start;
    iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar5 == 0) {
      s->read_from_callbacks = 0;
      psVar8 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar7 = 0;
    }
    else {
      psVar8 = psVar3 + iVar5;
      bVar7 = *psVar3;
    }
    s->img_buffer_end = psVar8;
    psVar3 = s->buffer_start + 1;
    s->img_buffer = psVar3;
  }
  if (bVar9 == 0) {
    if ((bVar7 & 0xf6) != 2) goto LAB_00129eac;
    if (((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
       (iVar5 = (int)psVar8 - (int)psVar3, 8 < iVar5)) {
      s->img_buffer = psVar3 + 9;
    }
    else {
      s->img_buffer = psVar8;
      (*(s->io).skip)(s->io_user_data,9 - iVar5);
    }
    bVar9 = 0;
  }
  else {
    if ((bVar7 & 0xf7) != 1) goto LAB_00129eac;
    if (((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
       (iVar5 = (int)psVar8 - (int)psVar3, 3 < iVar5)) {
      psVar3 = psVar3 + 4;
      s->img_buffer = psVar3;
    }
    else {
      s->img_buffer = psVar8;
      (*(s->io).skip)(s->io_user_data,4 - iVar5);
      psVar3 = s->img_buffer;
      psVar8 = s->img_buffer_end;
    }
    if (psVar3 < psVar8) {
      psVar4 = psVar3 + 1;
      s->img_buffer = psVar4;
      bVar9 = *psVar3;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_00129eac;
      psVar3 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        psVar8 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        bVar9 = 0;
      }
      else {
        psVar8 = psVar3 + iVar5;
        bVar9 = *psVar3;
      }
      s->img_buffer_end = psVar8;
      psVar4 = s->buffer_start + 1;
      s->img_buffer = psVar4;
    }
    if ((0x20 < bVar9) || ((0x101018100U >> ((ulong)bVar9 & 0x3f) & 1) == 0)) goto LAB_00129eac;
    if (((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
       (iVar5 = (int)psVar8 - (int)psVar4, 3 < iVar5)) {
      s->img_buffer = psVar4 + 4;
    }
    else {
      s->img_buffer = psVar8;
      (*(s->io).skip)(s->io_user_data,4 - iVar5);
    }
  }
  iVar5 = stbi__get16le(s);
  if ((iVar5 == 0) || (iVar1 = stbi__get16le(s), iVar1 == 0)) goto LAB_00129eac;
  psVar8 = s->img_buffer;
  psVar3 = s->img_buffer_end;
  if (psVar8 < psVar3) {
    s->img_buffer = psVar8 + 1;
    bVar10 = *psVar8;
    psVar8 = psVar8 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar10 = 0;
  }
  else {
    psVar8 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar8,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar3 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar10 = 0;
    }
    else {
      psVar3 = psVar8 + iVar2;
      bVar10 = *psVar8;
    }
    s->img_buffer_end = psVar3;
    psVar8 = s->buffer_start + 1;
    s->img_buffer = psVar8;
  }
  if (psVar8 < psVar3) {
LAB_00129e1f:
    s->img_buffer = psVar8 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar3 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      psVar3 = s->buffer_start + iVar2;
    }
    s->img_buffer_end = psVar3;
    psVar8 = s->buffer_start;
    goto LAB_00129e1f;
  }
  if (bVar9 == 0) {
    if (0xf < bVar10) {
      if ((bVar10 == 0x20) || (bVar10 == 0x18)) {
        uVar6 = (uint)(bVar10 >> 3);
      }
      else {
        if (bVar10 != 0x10) goto LAB_00129eac;
        uVar6 = (bVar7 & 0xf7) == 3 ^ 3;
      }
      goto LAB_00129eeb;
    }
LAB_00129e8c:
    uVar6 = 1;
    if (bVar10 == 8) goto LAB_00129eeb;
    if (bVar10 != 0xf) {
LAB_00129eac:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  else {
    if ((bVar10 != 8) && (bVar10 != 0x10)) goto LAB_00129eac;
    bVar10 = bVar9;
    if (bVar9 < 0x10) goto LAB_00129e8c;
    if ((bVar9 == 0x20) || (bVar9 == 0x18)) {
      uVar6 = (uint)(bVar9 >> 3);
      goto LAB_00129eeb;
    }
    if (bVar9 != 0x10) goto LAB_00129eac;
  }
  uVar6 = 3;
LAB_00129eeb:
  if (x != (int *)0x0) {
    *x = iVar5;
  }
  if (y != (int *)0x0) {
    *y = iVar1;
  }
  if (comp == (int *)0x0) {
    return 1;
  }
  *comp = uVar6;
  return 1;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp, tga_image_type, tga_bits_per_pixel, tga_colormap_bpp;
    int sz, tga_colormap_type;
    stbi__get8(s);                   // discard Offset
    tga_colormap_type = stbi__get8(s); // colormap type
    if( tga_colormap_type > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    tga_image_type = stbi__get8(s); // image type
    if ( tga_colormap_type == 1 ) { // colormapped (paletted) image
        if (tga_image_type != 1 && tga_image_type != 9) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip index of first colormap entry and number of entries
        sz = stbi__get8(s);    //   check bits per palette color entry
        if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip image x and y origin
        tga_colormap_bpp = sz;
    } else { // "normal" image w/o colormap - only RGB or grey allowed, +/- RLE
        if ( (tga_image_type != 2) && (tga_image_type != 3) && (tga_image_type != 10) && (tga_image_type != 11) ) {
            stbi__rewind(s);
            return 0; // only RGB or grey allowed, +/- RLE
        }
        stbi__skip(s,9); // skip colormap specification and image x/y origin
        tga_colormap_bpp = 0;
    }
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    tga_bits_per_pixel = stbi__get8(s); // bits per pixel
    stbi__get8(s); // ignore alpha bits
    if (tga_colormap_bpp != 0) {
        if((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16)) {
            // when using a colormap, tga_bits_per_pixel is the size of the indexes
            // I don't think anything but 8 or 16bit indexes makes sense
            stbi__rewind(s);
            return 0;
        }
        tga_comp = stbi__tga_get_comp(tga_colormap_bpp, 0, NULL);
    } else {
        tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3) || (tga_image_type == 11), NULL);
    }
    if(!tga_comp) {
      stbi__rewind(s);
      return 0;
    }
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp;
    return 1;                   // seems to have passed everything
}